

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O0

bool __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::windowEvent
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QEvent *event)

{
  Type TVar1;
  MouseButton MVar2;
  Int IVar3;
  int iVar4;
  int iVar5;
  QWidget *pQVar6;
  QRegion *pQVar7;
  QDockWidgetGroupLayout *pQVar8;
  socklen_t *psVar9;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  QEvent *in_RSI;
  QEvent *pQVar10;
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *in_RDI;
  long in_FS_OFFSET;
  QMouseEvent *e_2;
  QMouseEvent *e_1;
  QMouseEvent *e;
  QWidget *w;
  QRegion r;
  QPainter p;
  int in_stack_fffffffffffffeb8;
  MouseButton in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  WidgetAttribute in_stack_fffffffffffffec4;
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *in_stack_fffffffffffffec8;
  QWidget *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint uVar11;
  undefined4 in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee6;
  bool bVar12;
  undefined1 in_stack_fffffffffffffee7;
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *in_stack_fffffffffffffee8;
  QDockAreaLayoutInfo *in_stack_fffffffffffffef0;
  QPaintDevice *pQVar13;
  undefined4 in_stack_ffffffffffffff04;
  uint uVar14;
  QWidget *in_stack_ffffffffffffff08;
  QPainter *in_stack_ffffffffffffff10;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff18;
  bool local_c1;
  QRegion local_c0;
  QCursor local_b8;
  QCursor local_b0;
  QPointF local_a8;
  QPoint local_98;
  QPointF local_90;
  QPoint local_80;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_78;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_74;
  QPointF local_70;
  QPoint local_60;
  QPointF local_58;
  QPoint local_48 [3];
  QPointF local_30;
  QPoint local_20;
  QRegion local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = in_RSI;
  pQVar6 = window((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)0x5ff975);
  iVar4 = (int)pQVar10;
  TVar1 = QEvent::type(in_RSI);
  psVar9 = (socklen_t *)(ulong)TVar1;
  if (TVar1 == Timer) {
    iVar4 = QTimerEvent::timerId((QTimerEvent *)0x5ffe71);
    iVar5 = QBasicTimer::timerId((QBasicTimer *)0x5ffe83);
    if (iVar4 == iVar5) {
      QBasicTimer::stop();
      bVar12 = QList<int>::isEmpty((QList<int> *)0x5ffead);
      if (bVar12) {
        local_c1 = true;
      }
      else {
        bVar12 = ::operator==((QPoint *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (QPoint *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        if (bVar12) {
          local_c1 = true;
        }
        else {
          pQVar6 = window((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)0x5ffef2);
          pQVar8 = layout(in_RDI);
          QDockWidgetGroupLayout::dockAreaLayoutInfo(pQVar8);
          QDockAreaLayoutInfo::separatorRegion(in_stack_fffffffffffffef0);
          QWidget::update(in_stack_fffffffffffffed0,(QRegion *)pQVar6);
          QRegion::~QRegion(&local_c0);
          layout(in_RDI);
          layout(in_RDI);
          QDockAreaLayoutInfo::operator=
                    ((QDockAreaLayoutInfo *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (QDockAreaLayoutInfo *)
                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          pQVar8 = layout(in_RDI);
          QDockWidgetGroupLayout::dockAreaLayoutInfo(pQVar8);
          QDockAreaLayoutInfo::separatorMove
                    (in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->hoverSeparator,
                     (QPoint *)
                     CONCAT17(in_stack_fffffffffffffee7,
                              CONCAT16(in_stack_fffffffffffffee6,
                                       CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                                      )),(QPoint *)CONCAT44(in_stack_fffffffffffffedc,iVar4));
          in_RDI->movingSeparatorPos = in_RDI->movingSeparatorOrigin;
          local_c1 = true;
        }
      }
      goto LAB_005fffbf;
    }
  }
  else if (TVar1 == MouseButtonPress) {
    MVar2 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
    psVar9 = (socklen_t *)(ulong)MVar2;
    bVar12 = false;
    __addr = extraout_RDX;
    if (MVar2 == LeftButton) {
      local_58 = QSinglePointEvent::position((QSinglePointEvent *)0x5ffbbf);
      local_48[0] = QPointF::toPoint((QPointF *)in_stack_fffffffffffffed0);
      iVar4 = (int)local_48;
      bVar12 = startSeparatorMove((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                  (QPoint *)in_stack_fffffffffffffed0);
      __addr = extraout_RDX_00;
    }
    if (bVar12 != false) {
      QEvent::accept(in_RSI,iVar4,__addr,psVar9);
      local_c1 = true;
      goto LAB_005fffbf;
    }
  }
  else if (TVar1 == MouseButtonRelease) {
    local_a8 = QSinglePointEvent::position((QSinglePointEvent *)0x5ffd26);
    local_98 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffed0);
    iVar4 = (int)&local_98;
    bVar12 = endSeparatorMove(in_stack_fffffffffffffec8,
                              (QPoint *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if (bVar12) {
      QEvent::accept(in_RSI,iVar4,__addr_01,psVar9);
      local_c1 = true;
      goto LAB_005fffbf;
    }
  }
  else if (TVar1 == MouseMove) {
    local_70 = QSinglePointEvent::position((QSinglePointEvent *)0x5ffc36);
    local_60 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffed0);
    adjustCursor(in_stack_fffffffffffffee8,
                 (QPoint *)
                 CONCAT17(in_stack_fffffffffffffee7,
                          CONCAT16(in_stack_fffffffffffffee6,
                                   CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))));
    local_78.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QSinglePointEvent::buttons
                   ((QSinglePointEvent *)
                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    local_74.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QFlags<Qt::MouseButton>::operator&
                   ((QFlags<Qt::MouseButton> *)
                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffebc);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_74);
    if (IVar3 != 0) {
      local_90 = QSinglePointEvent::position((QSinglePointEvent *)0x5ffcb5);
      local_80 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffed0);
      iVar4 = (int)&local_80;
      bVar12 = separatorMove(in_stack_fffffffffffffec8,
                             (QPoint *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                            );
      if (bVar12) {
        QEvent::accept(in_RSI,iVar4,__addr_00,psVar9);
        local_c1 = true;
        goto LAB_005fffbf;
      }
    }
  }
  else if (TVar1 == Paint) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar13 = (QPaintDevice *)0x0;
    if (pQVar6 != (QWidget *)0x0) {
      pQVar13 = &pQVar6->super_QPaintDevice;
    }
    QPainter::QPainter((QPainter *)&local_10,pQVar13);
    local_18.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = QPaintEvent::region((QPaintEvent *)in_RSI);
    QRegion::QRegion(&local_18,(QRegion *)pQVar7);
    pQVar8 = layout(in_RDI);
    QDockWidgetGroupLayout::dockAreaLayoutInfo(pQVar8);
    QDockAreaLayoutInfo::paintSeparators
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (QRegion *)CONCAT44(in_stack_ffffffffffffff04,TVar1),(QPoint *)in_RDI);
    QRegion::~QRegion(&local_18);
    QPainter::~QPainter((QPainter *)&local_10);
  }
  else if (TVar1 == ShortcutOverride) {
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    adjustCursor(in_stack_fffffffffffffee8,
                 (QPoint *)
                 CONCAT17(in_stack_fffffffffffffee7,
                          CONCAT16(in_stack_fffffffffffffee6,
                                   CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))));
  }
  else {
    if (TVar1 == HoverEnter) {
      local_c1 = true;
      goto LAB_005fffbf;
    }
    if (TVar1 == HoverLeave) {
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
      adjustCursor(in_stack_fffffffffffffee8,
                   (QPoint *)
                   CONCAT17(in_stack_fffffffffffffee7,
                            CONCAT16(in_stack_fffffffffffffee6,
                                     CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)))
                  );
      local_c1 = true;
      goto LAB_005fffbf;
    }
    if (TVar1 == HoverMove) {
      local_30 = QSinglePointEvent::position((QSinglePointEvent *)0x5ffaf1);
      local_20 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffed0);
      adjustCursor(in_stack_fffffffffffffee8,
                   (QPoint *)
                   CONCAT17(in_stack_fffffffffffffee7,
                            CONCAT16(in_stack_fffffffffffffee6,
                                     CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)))
                  );
    }
    else if (TVar1 == CursorChange) {
      uVar14 = 0;
      bVar12 = false;
      if ((in_RDI->cursorAdjusted & 1U) != 0) {
        iVar4 = QCursor::shape();
        QWidget::cursor((QWidget *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        uVar14 = 0x1000000;
        iVar5 = QCursor::shape();
        bVar12 = iVar4 != iVar5;
      }
      uVar11 = CONCAT13(bVar12,(int3)in_stack_fffffffffffffedc);
      if ((uVar14 & 0x1000000) != 0) {
        QCursor::~QCursor(&local_b0);
      }
      if ((uVar11 & 0x1000000) != 0) {
        QWidget::cursor((QWidget *)CONCAT44(uVar11,in_stack_fffffffffffffed8));
        QCursor::operator=((QCursor *)in_stack_fffffffffffffed0,(QCursor *)in_stack_fffffffffffffec8
                          );
        QCursor::~QCursor(&local_b8);
        bVar12 = QWidget::testAttribute
                           ((QWidget *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
        in_RDI->hasOldCursor = bVar12;
        QWidget::setCursor((QWidget *)CONCAT44(uVar11,in_stack_fffffffffffffed8),
                           (QCursor *)in_stack_fffffffffffffed0);
      }
    }
  }
  local_c1 = false;
LAB_005fffbf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_c1;
}

Assistant:

bool QMainWindowLayoutSeparatorHelper<Layout>::windowEvent(QEvent *event)
{
    QWidget *w = window();
    switch (event->type()) {
    case QEvent::Paint: {
        QPainter p(w);
        QRegion r = static_cast<QPaintEvent *>(event)->region();
        layout()->dockAreaLayoutInfo()->paintSeparators(&p, w, r, hoverPos);
        break;
    }

#if QT_CONFIG(cursor)
    case QEvent::HoverMove: {
        adjustCursor(static_cast<QHoverEvent *>(event)->position().toPoint());
        break;
    }

    // We don't want QWidget to call update() on the entire QMainWindow
    // on HoverEnter and HoverLeave, hence accept the event (return true).
    case QEvent::HoverEnter:
        return true;
    case QEvent::HoverLeave:
        adjustCursor(QPoint(0, 0));
        return true;
    case QEvent::ShortcutOverride: // when a menu pops up
        adjustCursor(QPoint(0, 0));
        break;
#endif // QT_CONFIG(cursor)

    case QEvent::MouseButtonPress: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);
        if (e->button() == Qt::LeftButton && startSeparatorMove(e->position().toPoint())) {
            // The click was on a separator, eat this event
            e->accept();
            return true;
        }
        break;
    }

    case QEvent::MouseMove: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);

#if QT_CONFIG(cursor)
        adjustCursor(e->position().toPoint());
#endif
        if (e->buttons() & Qt::LeftButton) {
            if (separatorMove(e->position().toPoint())) {
                // We're moving a separator, eat this event
                e->accept();
                return true;
            }
        }

        break;
    }

    case QEvent::MouseButtonRelease: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);
        if (endSeparatorMove(e->position().toPoint())) {
            // We've released a separator, eat this event
            e->accept();
            return true;
        }
        break;
    }

#if QT_CONFIG(cursor)
    case QEvent::CursorChange:
        // CursorChange events are triggered as mouse moves to new widgets even
        // if the cursor doesn't actually change, so do not change oldCursor if
        // the "changed" cursor has same shape as adjusted cursor.
        if (cursorAdjusted && adjustedCursor.shape() != w->cursor().shape()) {
            oldCursor = w->cursor();
            hasOldCursor = w->testAttribute(Qt::WA_SetCursor);

            // Ensure our adjusted cursor stays visible
            w->setCursor(adjustedCursor);
        }
        break;
#endif // QT_CONFIG(cursor)
    case QEvent::Timer:
        if (static_cast<QTimerEvent *>(event)->timerId() == separatorMoveTimer.timerId()) {
            // let's move the separators
            separatorMoveTimer.stop();
            if (movingSeparator.isEmpty())
                return true;
            if (movingSeparatorOrigin == movingSeparatorPos)
                return true;

            // when moving the separator, we need to update the previous position
            window()->update(layout()->dockAreaLayoutInfo()->separatorRegion());

            layout()->layoutState = layout()->savedState;
            layout()->dockAreaLayoutInfo()->separatorMove(movingSeparator, movingSeparatorOrigin,
                                                          movingSeparatorPos);
            movingSeparatorPos = movingSeparatorOrigin;
            return true;
        }
        break;
    default:
        break;
    }
    return false;
}